

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprIdxCover(Walker *pWalker,Expr *pExpr)

{
  Index *pIVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = 0;
  if ((pExpr->op == 0xa2) && (pExpr->iTable == ((pWalker->u).pIdxCover)->iCur)) {
    pIVar1 = ((pWalker->u).pIdxCover)->pIdx;
    uVar3 = (ulong)pIVar1->nColumn;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        if (pIVar1->aiColumn[uVar4] == pExpr->iColumn) {
          if (-1 < (short)uVar4) {
            return 0;
          }
          break;
        }
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    pWalker->eCode = '\x01';
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

static int exprIdxCover(Walker *pWalker, Expr *pExpr){
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pWalker->u.pIdxCover->iCur
   && sqlite3ColumnOfIndex(pWalker->u.pIdxCover->pIdx, pExpr->iColumn)<0
  ){
    pWalker->eCode = 1;
    return WRC_Abort;
  }
  return WRC_Continue;
}